

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionClrStr.cpp
# Opt level: O2

int __thiscall
Hpipe::InstructionClrStr::clone
          (InstructionClrStr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int num_active_item;
  InstructionClrStr *pIVar1;
  InstructionNone *pIVar2;
  Context CStack_98;
  
  num_active_item =
       Vec<const_Hpipe::CharItem_*>::index_first
                 ((Vec<const_Hpipe::CharItem_*> *)__child_stack,
                  (this->super_InstructionWithCode).super_Instruction.cx.pos.
                  super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  *(uint *)&(this->super_InstructionWithCode).super_Instruction.field_0x174);
  if (-1 < num_active_item) {
    pIVar1 = (InstructionClrStr *)operator_new(0x1a8);
    InstructionClrStr(pIVar1,(Context *)__child_stack,&this->var,num_active_item);
    pIVar1 = PtrPool<Hpipe::Instruction,32>::operator<<
                       ((PtrPool<Hpipe::Instruction,32> *)__fn,pIVar1);
    return (int)pIVar1;
  }
  pIVar2 = (InstructionNone *)operator_new(0x178);
  Context::Context(&CStack_98,(Context *)__child_stack);
  InstructionNone::Instruction(pIVar2,&CStack_98);
  pIVar2 = PtrPool<Hpipe::Instruction,32>::operator<<((PtrPool<Hpipe::Instruction,32> *)__fn,pIVar2)
  ;
  Context::~Context(&CStack_98);
  return (int)pIVar2;
}

Assistant:

Instruction *InstructionClrStr::clone( PtrPool<Instruction> &inst_pool, const Context &ncx, const Vec<unsigned> &keep_ind ) {
    int ind = ncx.pos.index_first( cx.pos[ num_active_item ] );
    if ( ind >= 0 )
        return inst_pool << new InstructionClrStr( ncx, var, ind );
    return inst_pool << new InstructionNone( ncx );
}